

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

bool rest_block_filter(any *context,HTTPRequest *req,string *strURIPart)

{
  long lVar1;
  string str;
  string key;
  bool bVar2;
  bool bVar3;
  RESTResponseFormat RVar4;
  BlockFilterIndex *this;
  ChainstateManager *pCVar5;
  CBlockIndex *block_index;
  char *pcVar6;
  char *__s;
  string *psVar7;
  char in_R8B;
  byte unaff_R13B;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view str_00;
  string_view str_01;
  span<const_std::byte,_18446744073709551615UL> reply;
  undefined7 uStack_348;
  BlockFilterType in_stack_fffffffffffffcbf;
  undefined8 uStack_340;
  BlockFilterType filtertype;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uri_parts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  UniValue local_300;
  string local_2a8 [32];
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278 [16];
  string errmsg;
  string local_208;
  undefined1 local_1e8 [32];
  string strHex;
  BlockFilter filter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  optional<uint256> block_hash;
  string local_78;
  string param;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CheckWarmup(req);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_0025b7ee;
  }
  param._M_dataplus._M_p = (pointer)&param.field_2;
  param._M_string_length = 0;
  param.field_2._M_local_buf[0] = '\0';
  RVar4 = ParseDataFormat(&param,strURIPart);
  str_00._M_str = (char *)0x2f;
  str_00._M_len = (size_t)param._M_dataplus._M_p;
  util::SplitString_abi_cxx11_(&uri_parts,(util *)param._M_string_length,str_00,in_R8B);
  if ((long)uri_parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)uri_parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x40) {
    str_01._M_str = (char *)0x40;
    str_01._M_len =
         (size_t)uri_parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    detail::FromHex<uint256>
              (&block_hash,
               (detail *)
               uri_parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length,str_01);
    if (block_hash.super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged == false) {
      std::operator+(&local_c0,"Invalid hash: ",
                     uri_parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      RESTERR(req,HTTP_BAD_REQUEST,&local_c0);
      psVar7 = &local_c0;
      goto LAB_0025b7d0;
    }
    bVar2 = BlockFilterTypeByName
                      (uri_parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,&filtertype);
    if (!bVar2) {
      std::operator+(&local_e0,"Unknown filtertype ",
                     uri_parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      RESTERR(req,HTTP_BAD_REQUEST,&local_e0);
      psVar7 = &local_e0;
      goto LAB_0025b7d0;
    }
    this = GetBlockFilterIndex(in_stack_fffffffffffffcbf);
    if (this == (BlockFilterIndex *)0x0) {
      std::operator+(&local_100,"Index is not enabled for filtertype ",
                     uri_parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      RESTERR(req,HTTP_BAD_REQUEST,&local_100);
      psVar7 = &local_100;
      goto LAB_0025b7d0;
    }
    pCVar5 = GetChainman(context,req);
    if (pCVar5 == (ChainstateManager *)0x0) goto LAB_0025b7d5;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&filter,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rest.cpp"
               ,0x20b,false);
    block_index = node::BlockManager::LookupBlockIndex(&pCVar5->m_blockman,(uint256 *)&block_hash);
    if (block_index == (CBlockIndex *)0x0) {
      std::operator+(&local_120,
                     uri_parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1," not found");
      RESTERR(req,HTTP_NOT_FOUND,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    else {
      unaff_R13B = 4 < (block_index->nStatus & 7) && (block_index->nStatus & 0x60) == 0;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&filter);
    if (block_index == (CBlockIndex *)0x0) goto LAB_0025b7d5;
    bVar2 = BaseIndex::BlockUntilSyncedToCurrentChain(&this->super_BaseIndex);
    BlockFilter::BlockFilter(&filter);
    bVar3 = BlockFilterIndex::LookupFilter(this,block_index,&filter);
    if (bVar3) {
      if (RVar4 == JSON) {
        local_288 = local_278;
        local_280 = 0;
        local_278[0] = 0;
        str._M_dataplus._M_p._7_1_ = in_stack_fffffffffffffcbf;
        str._M_dataplus._M_p._0_7_ = uStack_348;
        str._M_string_length = uStack_340;
        str.field_2._M_allocated_capacity =
             (size_type)
             uri_parts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        str.field_2._8_8_ =
             uri_parts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        UniValue::UniValue((UniValue *)&errmsg,VOBJ,str);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_2a8,"filter",(allocator<char> *)local_1e8);
        s_00.m_size = (long)filter.m_filter.m_encoded.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)filter.m_filter.m_encoded.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
        s_00.m_data = filter.m_filter.m_encoded.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        HexStr_abi_cxx11_(&strHex,s_00);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_300,&strHex);
        key._M_dataplus._M_p._7_1_ = in_stack_fffffffffffffcbf;
        key._M_dataplus._M_p._0_7_ = uStack_348;
        key._M_string_length = uStack_340;
        key.field_2._M_allocated_capacity =
             (size_type)
             uri_parts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        key.field_2._8_8_ =
             uri_parts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        UniValue::pushKV((UniValue *)&errmsg,key,stack0xfffffffffffffcd8);
        UniValue::~UniValue(&local_300);
        std::__cxx11::string::~string((string *)&strHex);
        std::__cxx11::string::~string(local_2a8);
        UniValue::write_abi_cxx11_((UniValue *)local_1e8,(int)&errmsg,(void *)0x0,0);
        std::operator+(&strHex,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1e8,"\n");
        std::__cxx11::string::~string((string *)local_1e8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,"Content-Type",
                   (allocator<char> *)((long)register0x00000020 + -0x33a));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,"application/json",
                   (allocator<char> *)((long)register0x00000020 + -0x33b));
        HTTPRequest::WriteHeader(req,(string *)local_1e8,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)local_1e8);
        HTTPRequest::WriteReply
                  (req,200,(span<const_std::byte,_18446744073709551615UL>)strHex._0_16_);
        std::__cxx11::string::~string((string *)&strHex);
        UniValue::~UniValue((UniValue *)&errmsg);
      }
      else {
        if (RVar4 == HEX) {
          errmsg.field_2._M_allocated_capacity = 0;
          errmsg.field_2._8_8_ = 0;
          errmsg._M_dataplus._M_p = (pointer)0x0;
          errmsg._M_string_length = 0;
          BlockFilter::Serialize<DataStream>(&filter,(DataStream *)&errmsg);
          s.m_data = (uchar *)(errmsg._M_dataplus._M_p + errmsg.field_2._8_8_);
          s.m_size = errmsg._M_string_length - (long)s.m_data;
          HexStr_abi_cxx11_((string *)local_1e8,s);
          std::operator+(&strHex,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1e8,"\n");
          std::__cxx11::string::~string((string *)local_1e8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1e8,"Content-Type",
                     (allocator<char> *)((long)register0x00000020 + -0x33a));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,"text/plain",
                     (allocator<char> *)((long)register0x00000020 + -0x33b));
          HTTPRequest::WriteHeader(req,(string *)local_1e8,&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)local_1e8);
          HTTPRequest::WriteReply
                    (req,200,(span<const_std::byte,_18446744073709551615UL>)strHex._0_16_);
          std::__cxx11::string::~string((string *)&strHex);
        }
        else {
          if (RVar4 != BINARY) {
            AvailableDataFormatsString_abi_cxx11_();
            std::operator+(&errmsg,"output format not found (available: ",&strHex);
            std::operator+(&local_320,&errmsg,")");
            RESTERR(req,HTTP_NOT_FOUND,&local_320);
            std::__cxx11::string::~string((string *)&local_320);
            std::__cxx11::string::~string((string *)&errmsg);
            psVar7 = &strHex;
            goto LAB_0025b9fb;
          }
          errmsg.field_2._M_allocated_capacity = 0;
          errmsg.field_2._8_8_ = 0;
          errmsg._M_dataplus._M_p = (pointer)0x0;
          errmsg._M_string_length = 0;
          BlockFilter::Serialize<DataStream>(&filter,(DataStream *)&errmsg);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&strHex,"Content-Type",(allocator<char> *)&local_208);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1e8,"application/octet-stream",
                     (allocator<char> *)((long)register0x00000020 + -0x33a));
          HTTPRequest::WriteHeader(req,&strHex,(string *)local_1e8);
          std::__cxx11::string::~string((string *)local_1e8);
          std::__cxx11::string::~string((string *)&strHex);
          reply._M_ptr = (pointer)(errmsg._M_dataplus._M_p + errmsg.field_2._8_8_);
          reply._M_extent._M_extent_value = errmsg._M_string_length - (long)reply._M_ptr;
          HTTPRequest::WriteReply(req,200,reply);
        }
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&errmsg);
      }
      bVar2 = true;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&errmsg,"Filter not found.",(allocator<char> *)&strHex);
      pcVar6 = " Block filters are still in the process of being indexed.";
      if (bVar2) {
        pcVar6 = " This error is unexpected and indicates index corruption.";
      }
      __s = " Block was not connected to active chain.";
      if ((unaff_R13B & 1) != 0) {
        __s = pcVar6;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&errmsg,__s);
      std::__cxx11::string::string((string *)&stack0xfffffffffffffe58,&errmsg);
      RESTERR(req,HTTP_NOT_FOUND,(string *)&stack0xfffffffffffffe58);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
      psVar7 = &errmsg;
LAB_0025b9fb:
      std::__cxx11::string::~string((string *)psVar7);
      bVar2 = false;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&filter.m_filter.m_encoded.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               "Invalid URI format. Expected /rest/blockfilter/<filtertype>/<blockhash>",
               (allocator<char> *)&filter);
    RESTERR(req,HTTP_BAD_REQUEST,&local_78);
    psVar7 = &local_78;
LAB_0025b7d0:
    std::__cxx11::string::~string((string *)psVar7);
LAB_0025b7d5:
    bVar2 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&uri_parts);
  std::__cxx11::string::~string((string *)&param);
LAB_0025b7ee:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool rest_block_filter(const std::any& context, HTTPRequest* req, const std::string& strURIPart)
{
    if (!CheckWarmup(req)) return false;

    std::string param;
    const RESTResponseFormat rf = ParseDataFormat(param, strURIPart);

    // request is sent over URI scheme /rest/blockfilter/filtertype/blockhash
    std::vector<std::string> uri_parts = SplitString(param, '/');
    if (uri_parts.size() != 2) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid URI format. Expected /rest/blockfilter/<filtertype>/<blockhash>");
    }

    auto block_hash{uint256::FromHex(uri_parts[1])};
    if (!block_hash) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + uri_parts[1]);
    }

    BlockFilterType filtertype;
    if (!BlockFilterTypeByName(uri_parts[0], filtertype)) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Unknown filtertype " + uri_parts[0]);
    }

    BlockFilterIndex* index = GetBlockFilterIndex(filtertype);
    if (!index) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Index is not enabled for filtertype " + uri_parts[0]);
    }

    const CBlockIndex* block_index;
    bool block_was_connected;
    {
        ChainstateManager* maybe_chainman = GetChainman(context, req);
        if (!maybe_chainman) return false;
        ChainstateManager& chainman = *maybe_chainman;
        LOCK(cs_main);
        block_index = chainman.m_blockman.LookupBlockIndex(*block_hash);
        if (!block_index) {
            return RESTERR(req, HTTP_NOT_FOUND, uri_parts[1] + " not found");
        }
        block_was_connected = block_index->IsValid(BLOCK_VALID_SCRIPTS);
    }

    bool index_ready = index->BlockUntilSyncedToCurrentChain();

    BlockFilter filter;
    if (!index->LookupFilter(block_index, filter)) {
        std::string errmsg = "Filter not found.";

        if (!block_was_connected) {
            errmsg += " Block was not connected to active chain.";
        } else if (!index_ready) {
            errmsg += " Block filters are still in the process of being indexed.";
        } else {
            errmsg += " This error is unexpected and indicates index corruption.";
        }

        return RESTERR(req, HTTP_NOT_FOUND, errmsg);
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        DataStream ssResp{};
        ssResp << filter;

        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ssResp);
        return true;
    }
    case RESTResponseFormat::HEX: {
        DataStream ssResp{};
        ssResp << filter;

        std::string strHex = HexStr(ssResp) + "\n";
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }
    case RESTResponseFormat::JSON: {
        UniValue ret(UniValue::VOBJ);
        ret.pushKV("filter", HexStr(filter.GetEncodedFilter()));
        std::string strJSON = ret.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}